

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverCE.h
# Opt level: O1

double __thiscall BGIP_SolverCE::Solve(BGIP_SolverCE *this)

{
  int *piVar1;
  _List_node_base **pp_Var2;
  undefined1 auVar3 [16];
  long lVar4;
  pointer puVar5;
  long *plVar6;
  bool bVar7;
  char cVar8;
  _List_node_base *p_Var9;
  element_type *peVar10;
  int iVar11;
  undefined4 uVar12;
  size_type sVar13;
  size_type __n;
  ulong uVar14;
  JointPolicyPureVector *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar15;
  JPPVValuePair *this_01;
  ostream *poVar16;
  undefined8 *puVar17;
  _List_node_base *in_RCX;
  ulong uVar18;
  __time_t extraout_RDX;
  Index jTypeI;
  ulong uVar19;
  BGIP_SolverCE *pBVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  undefined1 in_XMM2 [16];
  timeval tVar24;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ta_vec;
  list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_> best_samples;
  shared_ptr<JointPolicyPureVector> p_jpol;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  Xi;
  timeval start_time;
  JointPolicyPureVector jpol_best;
  allocator_type local_1c9;
  undefined1 local_1c8 [40];
  list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_> local_1a0;
  double local_188;
  BGIP_SolverCE *local_180;
  double local_178;
  value_type_conflict2 local_16c;
  double local_168;
  size_type local_160;
  shared_ptr<JointPolicyPureVector> local_158;
  double local_148;
  ulong local_140;
  ulong local_138;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  local_130;
  I_PtPDpure_constPtr local_118;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  timeval local_e8;
  I_PtPDpure_constPtr local_d8;
  JointPolicyPureVector local_c8 [152];
  undefined1 extraout_var [56];
  
  (*(code *)**(undefined8 **)&this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>
  )();
  lVar4 = *(long *)&(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).
                    field_0x10;
  local_d8.px = *(element_type **)
                 &(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).field_0x8
  ;
  local_d8.pn.pi_ =
       *(sp_counted_base **)
        &(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).field_0x10;
  if (lVar4 != 0) {
    LOCK();
    piVar1 = (int *)(lVar4 + 8);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  local_1c8._0_8_ = (_List_node_base *)0x0;
  local_1c8._8_8_ = (_List_node_base *)0x0;
  JointPolicyPureVector::JointPolicyPureVector(local_c8,&local_d8,TYPE_INDEX);
  boost::detail::shared_count::~shared_count(&local_d8.pn);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1c8 + 8));
  iVar11 = gettimeofday(&local_e8,(__timezone_ptr_t)0x0);
  if (iVar11 == 0) {
    lVar4 = *(long *)&(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).
                      field_0x10;
    local_1c8._0_8_ =
         *(undefined8 *)
          &(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).field_0x8;
    local_1c8._8_8_ =
         *(undefined8 *)
          &(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).field_0x10;
    if (lVar4 != 0) {
      LOCK();
      piVar1 = (int *)(lVar4 + 8);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    sVar13 = (*(code *)(((pointer)local_1c8._0_8_)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[3])();
    boost::detail::shared_count::~shared_count((shared_count *)(local_1c8 + 8));
    lVar4 = *(long *)&(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).
                      field_0x10;
    local_1c8._0_8_ =
         *(undefined8 *)
          &(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).field_0x8;
    local_1c8._8_8_ =
         *(undefined8 *)
          &(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).field_0x10;
    if (lVar4 != 0) {
      LOCK();
      piVar1 = (int *)(lVar4 + 8);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    local_138 = BayesianGameBase::GetNrJointTypes();
    local_180 = this;
    boost::detail::shared_count::~shared_count((shared_count *)(local_1c8 + 8));
    std::
    vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ::vector(&local_130,sVar13,(allocator_type *)local_1c8);
    local_160 = sVar13;
    if (sVar13 != 0) {
      uVar14 = 0;
      do {
        lVar4 = *(long *)&(local_180->
                          super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).
                          field_0x10;
        local_1c8._0_8_ =
             *(undefined8 *)
              &(local_180->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).
               field_0x8;
        local_1c8._8_8_ =
             *(undefined8 *)
              &(local_180->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).
               field_0x10;
        if (lVar4 != 0) {
          LOCK();
          piVar1 = (int *)(lVar4 + 8);
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        sVar13 = (*(code *)(((pointer)local_1c8._0_8_)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start[5])(local_1c8._0_8_,uVar14,0,999999);
        boost::detail::shared_count::~shared_count((shared_count *)(local_1c8 + 8));
        lVar4 = *(long *)&(local_180->
                          super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).
                          field_0x10;
        local_1c8._0_8_ =
             *(undefined8 *)
              &(local_180->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).
               field_0x8;
        local_1c8._8_8_ =
             *(undefined8 *)
              &(local_180->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).
               field_0x10;
        if (lVar4 != 0) {
          LOCK();
          piVar1 = (int *)(lVar4 + 8);
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        __n = (*(code *)((_List_node_base *)local_1c8._0_8_)->_M_next[2]._M_next)
                        (local_1c8._0_8_,uVar14);
        boost::detail::shared_count::~shared_count((shared_count *)(local_1c8 + 8));
        auVar21 = vcvtusi2sd_avx512f(in_XMM2,__n);
        local_158.px = (element_type *)(1.0 / auVar21._0_8_);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)&local_1a0,__n,
                   (value_type_conflict *)&local_158,(allocator_type *)&local_16c);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)local_1c8,sVar13,(value_type *)&local_1a0,&local_1c9);
        sVar13 = local_160;
        if (local_1a0.super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>._M_impl.
            _M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
          operator_delete(local_1a0.
                          super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>.
                          _M_impl._M_node.super__List_node_base._M_next,
                          local_1a0.
                          super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>.
                          _M_impl._M_node._M_size -
                          (long)local_1a0.
                                super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>.
                                _M_impl._M_node.super__List_node_base._M_next);
        }
        uVar18 = ((long)local_130.
                        super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_130.
                        super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        if (uVar18 < uVar14 || uVar18 - uVar14 == 0) goto LAB_00111513;
        in_RCX = (_List_node_base *)(uVar14 * 3);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::operator=(local_130.
                    super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar14,
                    (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     *)local_1c8);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)local_1c8);
        uVar14 = (ulong)((int)uVar14 + 1);
      } while (uVar14 < sVar13);
    }
    pBVar20 = local_180;
    if (local_180->_m_nrRestarts == 0) {
      local_178 = -1.79769313486232e+308;
    }
    else {
      uVar14 = 0;
      local_178 = -1.79769313486232e+308;
      do {
        local_100 = uVar14;
        if (pBVar20->_m_nrIterations != 0) {
          uVar14 = 0;
          do {
            local_1c8._0_8_ = local_1c8 + 0x10;
            local_f8 = uVar14;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1c8,"CE deadline exceeded","");
            (**(code **)(*(long *)&pBVar20->
                                   super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>
                        + 8))(pBVar20,(string *)local_1c8);
            if ((_List_node_base *)local_1c8._0_8_ != (_List_node_base *)(local_1c8 + 0x10)) {
              operator_delete((void *)local_1c8._0_8_,
                              (ulong)((long)&(((_Vector_base<double,_std::allocator<double>_> *)
                                              local_1c8._16_8_)->_M_impl).super__Vector_impl_data.
                                             _M_start + 1));
            }
            local_1a0.super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>._M_impl.
            _M_node._M_size = 0;
            local_1a0.super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>._M_impl.
            _M_node.super__List_node_base._M_next = (_List_node_base *)&local_1a0;
            local_1a0.super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>._M_impl.
            _M_node.super__List_node_base._M_prev = (_List_node_base *)&local_1a0;
            if (pBVar20->_m_nrSampledJointPolicies != 0) {
              uVar14 = 0;
              local_148 = -1.79769313486232e+308;
              do {
                this_00 = (JointPolicyPureVector *)operator_new(0x98);
                lVar4 = *(long *)&(pBVar20->
                                  super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).
                                  field_0x10;
                local_118.px = *(element_type **)
                                &(pBVar20->
                                 super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).
                                 field_0x8;
                local_118.pn.pi_ =
                     *(sp_counted_base **)
                      &(pBVar20->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).
                       field_0x10;
                if (lVar4 != 0) {
                  LOCK();
                  piVar1 = (int *)(lVar4 + 8);
                  *piVar1 = *piVar1 + 1;
                  UNLOCK();
                }
                local_1c8._0_8_ = (_List_node_base *)0x0;
                local_1c8._8_8_ = (_List_node_base *)0x0;
                local_140 = uVar14;
                JointPolicyPureVector::JointPolicyPureVector(this_00,&local_118);
                boost::shared_ptr<JointPolicyPureVector>::shared_ptr<JointPolicyPureVector>
                          (&local_158,this_00);
                boost::detail::shared_count::~shared_count(&local_118.pn);
                boost::detail::shared_count::~shared_count((shared_count *)(local_1c8 + 8));
                peVar10 = local_158.px;
                pBVar20 = local_180;
                if (sVar13 != 0) {
                  uVar18 = 1;
                  uVar19 = 0;
                  do {
                    uVar14 = uVar18;
                    if ((ulong)(*(long *)(peVar10 + 0x70) - *(long *)(peVar10 + 0x68) >> 3) <=
                        uVar19) goto LAB_00111500;
                    SampleIndividualPolicy
                              (*(PolicyPureVector **)(*(long *)(peVar10 + 0x68) + uVar19 * 8),
                               local_130.
                               super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar19);
                    uVar18 = (ulong)((int)uVar14 + 1);
                    uVar19 = uVar14;
                  } while (uVar14 < sVar13);
                }
                lVar4 = *(long *)&(pBVar20->
                                  super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).
                                  field_0x10;
                p_Var9 = *(_List_node_base **)
                          &(pBVar20->
                           super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).
                           field_0x8;
                local_1c8._8_8_ =
                     *(undefined8 *)
                      &(pBVar20->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).
                       field_0x10;
                if (lVar4 != 0) {
                  LOCK();
                  piVar1 = (int *)(lVar4 + 8);
                  *piVar1 = *piVar1 + 1;
                  UNLOCK();
                }
                local_1c8._0_8_ = p_Var9;
                boost::detail::shared_count::~shared_count((shared_count *)(local_1c8 + 8));
                if (local_138 == 0) {
                  local_188 = 0.0;
                }
                else {
                  local_188 = 0.0;
                  uVar14 = 0;
                  do {
                    jTypeI = (Index)uVar14;
                    if ((jTypeI * 0x3afb7e91 >> 4 | jTypeI * 0x10000000) < 0x68db9) {
                      local_1c8._0_8_ = local_1c8 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_1c8,"CE deadline exceeded","");
                      (**(code **)(*(long *)&local_180->
                                             super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>
                                  + 8))(local_180,(string *)local_1c8);
                      if ((_List_node_base *)local_1c8._0_8_ !=
                          (_List_node_base *)(local_1c8 + 0x10)) {
                        operator_delete((void *)local_1c8._0_8_,
                                        (ulong)((long)&(((
                                                  _Vector_base<double,_std::allocator<double>_> *)
                                                  local_1c8._16_8_)->_M_impl).
                                                  super__Vector_impl_data._M_start + 1));
                      }
                    }
                    local_168 = (double)(*(code *)p_Var9->_M_next[6]._M_prev)(p_Var9,uVar14);
                    if (0.0 < local_168) {
                      pvVar15 = BayesianGameBase::JointToIndividualTypeIndices
                                          ((BayesianGameBase *)p_Var9,jTypeI);
                      local_16c = 0;
                      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,
                                 sVar13,&local_16c,(allocator_type *)&local_1c9);
                      if (sVar13 != 0) {
                        uVar18 = 0;
                        uVar19 = 1;
                        do {
                          if ((((ulong)(*(long *)(peVar10 + 0x70) - *(long *)(peVar10 + 0x68) >> 3)
                                <= uVar18) ||
                              (puVar5 = (pvVar15->
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        )._M_impl.super__Vector_impl_data._M_start,
                              (ulong)((long)(pvVar15->
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                      (long)puVar5 >> 2) <= uVar18)) ||
                             (plVar6 = *(long **)(*(long *)(peVar10 + 0x68) + uVar18 * 8),
                             uVar12 = (**(code **)(*plVar6 + 0x40))(plVar6,puVar5[uVar18]),
                             (ulong)((long)(local_1c8._8_8_ - local_1c8._0_8_) >> 2) <= uVar18)) {
                            std::__throw_out_of_range_fmt
                                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                       ,uVar18);
                            goto LAB_00111500;
                          }
                          *(undefined4 *)((long)(_List_node_base **)local_1c8._0_8_ + uVar18 * 4) =
                               uVar12;
                          bVar7 = uVar19 < local_160;
                          uVar18 = uVar19;
                          uVar19 = (ulong)((int)uVar19 + 1);
                        } while (bVar7);
                      }
                      uVar12 = (*(code *)p_Var9->_M_next[3]._M_prev)(p_Var9,local_1c8);
                      auVar23._0_8_ = (*(code *)p_Var9->_M_next[8]._M_next)(p_Var9,uVar14,uVar12);
                      auVar23._8_56_ = extraout_var;
                      auVar21 = auVar23._0_16_;
                      if ((_List_node_base *)local_1c8._0_8_ != (_List_node_base *)0x0) {
                        local_f0 = auVar23._0_8_;
                        operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ - local_1c8._0_8_);
                        auVar21._8_8_ = 0;
                        auVar21._0_8_ = local_f0;
                      }
                      auVar22._8_8_ = 0;
                      auVar22._0_8_ = local_188;
                      auVar3._8_8_ = 0;
                      auVar3._0_8_ = local_168;
                      auVar21 = vfmadd231sd_fma(auVar22,auVar21,auVar3);
                      local_188 = auVar21._0_8_;
                      sVar13 = local_160;
                    }
                    uVar14 = (ulong)(jTypeI + 1);
                  } while (uVar14 < local_138);
                }
                uVar14 = local_140;
                pBVar20 = local_180;
                in_RCX = (_List_node_base *)local_180->_m_nrJointPoliciesForUpdate;
                if (((local_1a0.super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>.
                      _M_impl._M_node._M_size < in_RCX) || (local_148 < local_188)) &&
                   ((local_180->_m_use_gamma != true || (-1.79769313486232e+308 < local_188)))) {
                  if ((_List_node_base *)
                      local_1a0.super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>.
                      _M_impl._M_node._M_size == in_RCX) {
                    if (local_1a0.
                        super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>._M_impl.
                        _M_node.super__List_node_base._M_prev[1]._M_next != (_List_node_base *)0x0)
                    {
                      (*(code *)(local_1a0.
                                 super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>
                                 ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next)->_M_next
                                ->_M_prev)();
                    }
                    p_Var9 = local_1a0.
                             super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>.
                             _M_impl._M_node.super__List_node_base._M_prev;
                    local_1a0.super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>.
                    _M_impl._M_node._M_size =
                         (long)&((_List_node_base *)
                                (local_1a0.
                                 super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>
                                 ._M_impl._M_node._M_size + -0x10))->_M_prev + 7;
                    std::__detail::_List_node_base::_M_unhook();
                    operator_delete(p_Var9,0x18);
                  }
                  this_01 = (JPPVValuePair *)operator_new(0x20);
                  JPPVValuePair::JPPVValuePair(this_01,(shared_ptr *)&local_158,local_188);
                  OrderedInsertJPPVValuePair(this_01,&local_1a0);
                  local_148 = (double)(*(code *)(local_1a0.
                                                 super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>
                                                 ._M_impl._M_node.super__List_node_base._M_prev[1].
                                                _M_next)->_M_next[1]._M_prev)();
                }
                boost::detail::shared_count::~shared_count(&local_158.pn);
                uVar14 = (ulong)((int)uVar14 + 1);
              } while (uVar14 < pBVar20->_m_nrSampledJointPolicies);
            }
            if (pBVar20->_m_use_gamma != false) {
              (*(code *)(local_1a0.
                         super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>._M_impl
                         ._M_node.super__List_node_base._M_prev[1]._M_next)->_M_next[1]._M_prev)();
            }
            local_168 = (double)(*(code *)(local_1a0.
                                           super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>
                                           ._M_impl._M_node.super__List_node_base._M_next[1]._M_next
                                          )->_M_next[1]._M_prev)();
            if (local_178 < local_168) {
              if ((pBVar20->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).
                  field_0xc8 == '\x01') {
                tVar24.tv_usec = (__suseconds_t)in_RCX;
                tVar24.tv_sec = extraout_RDX;
                local_188 = (double)TimeTools::GetDeltaTimeDouble(local_e8,tVar24);
                poVar16 = std::ostream::_M_insert<double>(local_168);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\t",1);
                poVar16 = std::ostream::_M_insert<double>(local_188);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\t",1);
              }
              in_RCX = local_1a0.super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>
                       ._M_impl._M_node.super__List_node_base._M_next[1]._M_next;
              local_1c8._0_8_ = in_RCX[1]._M_next;
              local_1c8._8_8_ = in_RCX[1]._M_prev;
              if (in_RCX[1]._M_prev != (_List_node_base *)0x0) {
                LOCK();
                pp_Var2 = &(in_RCX[1]._M_prev)->_M_prev;
                *(int *)pp_Var2 = *(int *)pp_Var2 + 1;
                UNLOCK();
              }
              JointPolicyPureVector::operator=(local_c8,(JointPolicyPureVector *)local_1c8._0_8_);
              boost::detail::shared_count::~shared_count((shared_count *)(local_1c8 + 8));
              local_178 = local_168;
            }
            UpdateCEProbDistribution(pBVar20,&local_130,&local_1a0);
            while (local_1a0.super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>.
                   _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_1a0) {
              if (local_1a0.super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>.
                  _M_impl._M_node.super__List_node_base._M_next[1]._M_next != (_List_node_base *)0x0
                 ) {
                (*(code *)(local_1a0.
                           super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>.
                           _M_impl._M_node.super__List_node_base._M_next[1]._M_next)->_M_next->
                          _M_prev)();
              }
              p_Var9 = local_1a0.super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>
                       ._M_impl._M_node.super__List_node_base._M_next;
              local_1a0.super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>._M_impl.
              _M_node._M_size =
                   (long)&((_List_node_base *)
                          (local_1a0.
                           super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>.
                           _M_impl._M_node._M_size + -0x10))->_M_prev + 7;
              std::__detail::_List_node_base::_M_unhook();
              operator_delete(p_Var9,0x18);
            }
            uVar14 = (ulong)((int)local_f8 + 1);
          } while (uVar14 < pBVar20->_m_nrIterations);
        }
        uVar14 = (ulong)((int)local_100 + 1);
      } while (uVar14 < pBVar20->_m_nrRestarts);
    }
    if ((pBVar20->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).field_0xc8 !=
        '\0') {
      plVar6 = *(long **)&(pBVar20->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>
                          ).field_0xd0;
      cVar8 = (char)plVar6;
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + cVar8);
      std::ostream::put(cVar8);
      std::ostream::flush();
      plVar6 = *(long **)&(pBVar20->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>
                          ).field_0xd8;
      cVar8 = (char)plVar6;
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + cVar8);
      std::ostream::put(cVar8);
      std::ostream::flush();
    }
    BGIPSolution::AddSolution
              ((JointPolicyPureVector *)
               &(pBVar20->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).
                field_0x18,local_178);
    std::
    vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ::~vector(&local_130);
    JointPolicyPureVector::~JointPolicyPureVector(local_c8);
    return local_178;
  }
LAB_00111524:
  puVar17 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar17 = "Error with gettimeofday";
  __cxa_throw(puVar17,&char_const*::typeinfo,0);
LAB_00111500:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00111513:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar14);
  goto LAB_00111524;
}

Assistant:

double Solve()
        {
            InitDeadline();

            double v_best = -DBL_MAX;
            //Index jpolI_best = 0;
            JointPolicyPureVector jpol_best(this->GetBGIPI(), TYPE_INDEX); //temporary?
            
            struct timeval start_time, cur_time;
            if(gettimeofday(&start_time, NULL) != 0)
                throw "Error with gettimeofday";
            
        //the algorithm has the following form
        //create initial joint policy distribution
        //for number of restarts
            //while improving
                //sample joint policies
                //evaluate and rank the sampled policies
                //update the probability distribution

            //get some vars:
            size_t nrAgents = this->GetBGIPI()->GetNrAgents();
            size_t nrJT = this->GetBGIPI()->GetNrJointTypes();

            //create initial joint policy distribution
            //Xi is the parameter 'std::vector' for the joint probability distribution 
            //with the following form:
            //Xi[agentI][typeI][actionI] (= Pr(actionI | typeI, agentI) )
            std::vector< std::vector< std::vector<double> > > Xi (nrAgents);
            for(Index agentI=0; agentI < nrAgents; agentI++)
            {
                size_t nrTypes = 
                    this->GetBGIPI()->GetNrPolicyDomainElements(agentI, 
                                                             TYPE_INDEX);
                size_t nrAcs = this->GetBGIPI()->GetNrActions(agentI);
                std::vector< std::vector<double> > ta_vec =
                    std::vector< std::vector<double> >(nrTypes, 
                                             std::vector<double>(nrAcs, 1.0 / nrAcs) ); //uniform dist. at start
                Xi.at(agentI)=ta_vec;
            }

            //for number of restarts
            for(Index restart=0; restart < _m_nrRestarts; restart++)
            {
                //for now, we use a fixed number of iterations:
                for(Index iter=0; iter < _m_nrIterations; iter++)
                {
                    CheckDeadline("CE deadline exceeded");

                    std::list<JPPVValuePair*> best_samples;
                    double v_xth_best = -DBL_MAX;
                    double v_gamma = -DBL_MAX;
                    for(Index sample=0; sample < _m_nrSampledJointPolicies; sample++)
                    {
                        boost::shared_ptr<JointPolicyPureVector> p_jpol =
                            boost::shared_ptr<JointPolicyPureVector>(new JointPolicyPureVector( this->GetBGIPI() ));
                        //sample next joint policy
                        std::vector< PolicyPureVector* > & BGpolicies = p_jpol->
                            GetIndividualPolicies();
                        for(Index agentI=0; agentI < nrAgents; agentI++)
                            //sample individual policy for next agent
                            SampleIndividualPolicy(*(BGpolicies.at(agentI)),Xi[agentI]);
#if DEBUG_BGIP_SOLVER_CE
                        {
                            std::cout << "sampled new policy: "<<
                                p_jpol->GetIndex();
                        }
#endif                
                        //evaluate 
                        double v = 0.0;        

                        const BayesianGameIdenticalPayoffInterface* bgipRawPtr=this->GetBGIPI().get();
                        for(Index jt = 0; jt < nrJT; jt++)
                        {
                            if(jt % 10000 == 0)
                                CheckDeadline("CE deadline exceeded");

                            double P_jt = bgipRawPtr->GetProbability(jt);
                            if(P_jt>0)
                            {
                                const std::vector<Index>& indTypes = bgipRawPtr->
                                    JointToIndividualTypeIndices(jt);
                                std::vector<Index> indAcs(nrAgents, 0);
                                //determine action of agentI 
                                for(Index agentI=0; agentI < nrAgents; agentI++)
                                    indAcs.at(agentI) = BGpolicies.at(agentI)->
                                        GetActionIndex(indTypes.at(agentI));
                                
                                Index ja = bgipRawPtr->IndividualToJointActionIndices(indAcs);
                                v += P_jt * bgipRawPtr->GetUtility(jt, ja);
                            }
                        }
#if DEBUG_BGIP_SOLVER_CE
                        std::cout << ", value="<<v<<std::endl;
#endif                
                        //retain it if it ranks among the best...
                        //we maintain an ordered std::list with contains the x best
                        //policies (pol-val pairs). (x = _m_nrJointPoliciesForUpdate)
                        //front() is the highest ranked policy and
                        //back() the lowest ranked one.
                        if(
                            //either we have not sampled x policies
                            (   best_samples.size() <  _m_nrJointPoliciesForUpdate
                                || 
                                //or the value of this policy is better 
                                (v > v_xth_best)
                                )
                            &&  ( (!_m_use_gamma) || (v > v_gamma)  )
                            )
                        {
                            if (best_samples.size() ==  _m_nrJointPoliciesForUpdate)
                            {
#if DEBUG_BGIP_SOLVER_CE
                                std::cout << "best_samples full: making space...";
#endif
                                delete best_samples.back();
                                best_samples.pop_back(); //make room
                            }
                            JPPVValuePair* polval = new JPPVValuePair(p_jpol,v);
                            OrderedInsertJPPVValuePair(polval, best_samples);
                            JPPVValuePair* back = best_samples.back();
                            v_xth_best = back->GetValue();
#if DEBUG_BGIP_SOLVER_CE
                            std::cout << "inserted pol (v="<<v<<") - v_xth_best now:"
                                 << v_xth_best << std::endl;
                            std::cout <<"best_samples contains the following pol/val pairs:"
                                 << std::endl;
                            PrintBestSamples(best_samples);
                            std::cout << std::endl;
#endif
                        }
                        else
                        {
//                            delete p_jpol;
                        }
                    } //end for samples
                    if(_m_use_gamma) //update the gamma
                    {
                        JPPVValuePair* back = best_samples.back();
                        v_gamma = back->GetValue();
#if DEBUG_BGIP_SOLVER_CE
                        std::cout << "new v_gamma="<<v_gamma<<std::endl;
#endif
                    }
                    //retain the very best sample:
                    double v_best_this_iter = best_samples.front()->GetValue();
                    if(v_best_this_iter > v_best)
                    {
#if DEBUG_BGIP_SOLVER_CE
                        std::cout << "new absolute best="<<v_best_this_iter <<
                            " (old="<< v_best <<")"<<std::endl;
#endif
                        v_best = v_best_this_iter;
                        if(this->GetWriteAnyTimeResults()){
                            double delta  = TimeTools::GetDeltaTimeDouble(start_time, cur_time);

                            (*this->GetResultsOFStream()) << v_best << "\t";
                            (*this->GetTimingsOFStream()) << delta << "\t";
                            
                        }
                        //LIndex too short...
                        //jpolI_best = best_samples.front()->GetJPPV()->GetIndex();
                        jpol_best =  *(best_samples.front()->GetJPPV());
                    }
                
                    //update the probability distribution
                    UpdateCEProbDistribution(Xi, best_samples);
#if DEBUG_BGIP_SOLVER_CE
                    for(Index agentI=0; agentI < nrAgents; agentI++)
                    {
                        std::cout << "updated parameter std::vector for agent "<<agentI<<":";
                        PrintVectorCout(Xi[agentI]);
                        std::cout << std::endl;
                    }
#endif
                    //delete std::list
                    while(!best_samples.empty())
                    {
                        delete best_samples.front();
                        best_samples.pop_front();
                    }
                } //end iteration
            } // end restart
            //end the line in the results file
            if(this->GetWriteAnyTimeResults()){
                (*this->GetResultsOFStream()) << std::endl;
                (*this->GetTimingsOFStream()) << std::endl;
            } 

            //JointPolicyPureVector best_found(*this->GetBGIPI());
            //best_found.SetIndex(jpolI_best);
            //_m_solution.SetPolicy(best_found);

            this->AddSolution(jpol_best,v_best);
            
            return(v_best);
        }